

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O1

bool __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::load_data(section_impl<ELFIO::Elf64_Shdr> *this)

{
  char *pcVar1;
  int iVar2;
  const_iterator __begin2;
  pointer paVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  ulong uVar4;
  
  uVar4 = (this->header).sh_offset;
  uVar7 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
          (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
          (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
  if (this->convertor->need_conversion == false) {
    uVar7 = uVar4;
  }
  for (paVar3 = (this->translator->addr_translations).
                super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 != (this->translator->addr_translations).
                super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                ._M_impl.super__Vector_impl_data._M_finish; paVar3 = paVar3 + 0x30) {
    lVar6 = uVar7 - *(long *)paVar3;
    if ((*(long *)paVar3 <= (long)uVar7) && (lVar6 < *(long *)(paVar3 + 0x10))) {
      uVar7 = lVar6 + *(long *)(paVar3 + 0x20);
      break;
    }
  }
  iVar2 = (*(this->super_section)._vptr_section[0x13])(this);
  uVar4 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->super_section)._vptr_section[0x20])(this);
  if (((uVar7 <= CONCAT44(extraout_var_00,iVar2)) &&
      (iVar2 = (*(this->super_section)._vptr_section[0x20])(this),
      uVar4 <= CONCAT44(extraout_var_01,iVar2))) &&
     (iVar2 = (*(this->super_section)._vptr_section[0x20])(this),
     uVar4 <= CONCAT44(extraout_var_02,iVar2) - uVar7)) {
    if ((((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) ||
        (iVar2 = (*(this->super_section)._vptr_section[5])(this), iVar2 == 0)) ||
       (iVar2 = (*(this->super_section)._vptr_section[5])(this), iVar2 == 8)) {
      bVar8 = true;
      if (((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) &&
         (iVar2 = (*(this->super_section)._vptr_section[5])(this), iVar2 != 0)) {
        iVar2 = (*(this->super_section)._vptr_section[5])(this);
        bVar8 = iVar2 == 8;
      }
      this->is_loaded = bVar8;
      return bVar8;
    }
    if (uVar4 != 0xffffffffffffffff) {
      pcVar5 = (char *)operator_new__(uVar4 + 1,(nothrow_t *)&std::nothrow);
      pcVar1 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar5;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      if (uVar4 == 0) {
        this->data_size = 0;
LAB_0010e667:
        this->is_loaded = true;
        return true;
      }
      if ((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl != (char *)0x0) {
        std::istream::seekg(this->pstream,uVar7,0);
        std::istream::read((char *)this->pstream,
                           (long)(this->data)._M_t.
                                 super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                 super__Head_base<0UL,_char_*,_false>._M_head_impl);
        if (*(ulong *)(this->pstream + 8) == uVar4) {
          this->data_size = uVar4;
          (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar4] = '\0';
          goto LAB_0010e667;
        }
        pcVar1 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
        if (pcVar1 != (char *)0x0) {
          operator_delete__(pcVar1);
        }
      }
      this->data_size = 0;
    }
  }
  return false;
}

Assistant:

bool load_data() const
    {
        Elf_Xword sh_offset = (*translator)[(*convertor)(header.sh_offset)];
        Elf_Xword size = get_size();
        
        // Check for integer overflow in offset calculation
        if (sh_offset > get_stream_size()) {
            return false;
        }
        
        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - sh_offset)) {
            return false;
        }

        // Check if we need to load data
        if (nullptr == data && SHT_NULL != get_type() && SHT_NOBITS != get_type()) {
            // Check if size can be safely converted to size_t
            if (size > std::numeric_limits<size_t>::max() - 1) {
                return false;
            }
            
            data.reset(new (std::nothrow) char[size_t(size) + 1]);

            if ((0 != size) && (nullptr != data)) {
                pstream->seekg(sh_offset);
                pstream->read(data.get(), size);
                if (static_cast<Elf_Xword>(pstream->gcount()) != size) {
                    data.reset(nullptr);
                    data_size = 0;
                    return false;
                }

                data_size = size;
                data.get()[size] = 0; // Safe now as we allocated size + 1
            }
            else {
                data_size = 0;
                if (size != 0) {
                    return false; // Failed to allocate required memory
                }
            }
            
            is_loaded = true;
            return true;
        }

        // Data already loaded or doesn't need loading
        is_loaded = (nullptr != data) || (SHT_NULL == get_type()) || (SHT_NOBITS == get_type());
        return is_loaded;
    }